

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gf.h
# Opt level: O2

uint gf_matr_det(uint **M,uint rows,uint cols)

{
  uint *puVar1;
  uint *puVar2;
  uint uVar3;
  uint uVar4;
  
  if (rows == 2 || rows == cols) {
    puVar1 = *M;
    puVar2 = M[1];
    uVar3 = gf_mul(*puVar1,puVar2[1]);
    uVar4 = gf_mul(*puVar2,puVar1[1]);
    return uVar4 ^ uVar3;
  }
  fatal((uchar *)"gf_det",(uchar *)"only 2x2 matrix\n");
}

Assistant:

uint32_t gf_matr_det(uint32_t **M, uint32_t rows, uint32_t cols)
{
    if (rows != cols && rows != 2)
        fatal("gf_det", "only 2x2 matrix\n");

    uint32_t first = gf_mul(M[0][0], M[1][1]);
    uint32_t second = gf_mul(M[1][0], M[0][1]);
    return gf_sum(first, second);
}